

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_fut.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int local_d4;
  undefined1 local_d0 [8];
  future<int> fut;
  int b;
  int a;
  ThreadPool t;
  
  ThreadPool::ThreadPool((ThreadPool *)&b,true);
  fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 10;
  fut.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0x16;
  local_d4 = 10;
  ThreadPool::submit<int(&)(int,int),int,int>
            ((ThreadPool *)local_d0,(_func_int_int_int *)&b,(int *)sum,&local_d4);
  iVar1 = std::future<int>::get((future<int> *)local_d0);
  iVar2 = sum(fut.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_,
              (int)fut.super___basic_future<int>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
  if (iVar1 == iVar2) {
    std::future<int>::~future((future<int> *)local_d0);
    ThreadPool::~ThreadPool((ThreadPool *)&b);
    return 0;
  }
  __assert_fail("fut.get() == sum(a, b)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Hellzy[P]cpp-threadpool/tests/basic_fut.cc"
                ,0x12,"int main()");
}

Assistant:

int main()
{

    ThreadPool t;
    int a = 10;
    int b = 22;

    auto fut = t.submit(sum, 10, 22);
    assert(fut.get() == sum(a, b));

    return 0;
}